

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_feature_filter.cpp
# Opt level: O0

bool __thiscall
Fossilize::FeatureFilter::Impl::register_shader_module_info
          (Impl *this,VkShaderModule module,VkShaderModuleCreateInfo *info)

{
  bool bVar1;
  mapped_type *this_00;
  lock_guard<std::mutex> local_48;
  lock_guard<std::mutex> holder;
  ModuleInfo module_info;
  VkShaderModuleCreateInfo *info_local;
  VkShaderModule module_local;
  Impl *this_local;
  
  info_local = (VkShaderModuleCreateInfo *)module;
  module_local = (VkShaderModule)this;
  ModuleInfo::ModuleInfo((ModuleInfo *)&holder);
  bVar1 = parse_module_info(this,info->pCode,info->codeSize,(ModuleInfo *)&holder);
  if (bVar1) {
    bVar1 = std::
            vector<Fossilize::FeatureFilter::Impl::DeferredEntryPoint,_std::allocator<Fossilize::FeatureFilter::Impl::DeferredEntryPoint>_>
            ::empty((vector<Fossilize::FeatureFilter::Impl::DeferredEntryPoint,_std::allocator<Fossilize::FeatureFilter::Impl::DeferredEntryPoint>_>
                     *)&holder);
    if (!bVar1) {
      std::lock_guard<std::mutex>::lock_guard(&local_48,&this->module_to_info_lock);
      this_00 = std::
                unordered_map<VkShaderModule_T_*,_Fossilize::FeatureFilter::Impl::ModuleInfo,_std::hash<VkShaderModule_T_*>,_std::equal_to<VkShaderModule_T_*>,_std::allocator<std::pair<VkShaderModule_T_*const,_Fossilize::FeatureFilter::Impl::ModuleInfo>_>_>
                ::operator[](&this->module_to_info,(key_type *)&info_local);
      ModuleInfo::operator=(this_00,(ModuleInfo *)&holder);
      std::lock_guard<std::mutex>::~lock_guard(&local_48);
    }
    this_local._7_1_ = 1;
  }
  else {
    this_local._7_1_ = 0;
  }
  ModuleInfo::~ModuleInfo((ModuleInfo *)&holder);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool FeatureFilter::Impl::register_shader_module_info(VkShaderModule module, const VkShaderModuleCreateInfo *info)
{
	ModuleInfo module_info;
	if (parse_module_info(info->pCode, info->codeSize, module_info))
	{
		if (!module_info.deferred_entry_points.empty())
		{
			std::lock_guard<std::mutex> holder{module_to_info_lock};
			module_to_info[module] = std::move(module_info);
		}
		return true;
	}
	else
		return false;
}